

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O0

int ProcessFrameSBG(SBG *pSBG,uchar *frame,int framelen,int mid,int mclass,SBGDATA *pSBGData)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_b8;
  double local_b0;
  double yaw;
  double pitch;
  double roll;
  uDouble_SBG dval;
  uFloat_SBG fval;
  uInt_SBG uival;
  uShort_SBG usval;
  uchar ucval;
  int offset;
  SBGDATA *pSBGData_local;
  int mclass_local;
  int mid_local;
  int framelen_local;
  uchar *frame_local;
  SBG *pSBG_local;
  
  if (mclass != 0) {
    return 0;
  }
  if (mid - 2U < 0x11 || mid == 0x13) {
    switch((long)&switchD_001b4f58::switchdataD_001ee0b0 +
           (long)(int)(&switchD_001b4f58::switchdataD_001ee0b0)[mid - 2U]) {
    case 0x1b4f5a:
      pSBGData->TS = *(uint *)(frame + 6);
      (pSBGData->UTCTime).Valid = (uchar)((int)(*(ushort *)(frame + 10) & 0x3c0) >> 6);
      (pSBGData->UTCTime).Year = *(unsigned_short *)(frame + 0xc);
      (pSBGData->UTCTime).Month = frame[0xe];
      (pSBGData->UTCTime).Day = frame[0xf];
      (pSBGData->UTCTime).Hour = frame[0x10];
      (pSBGData->UTCTime).Minute = frame[0x11];
      (pSBGData->UTCTime).Seconds = frame[0x12];
      (pSBGData->UTCTime).Nanoseconds = *(uint *)(frame + 0x13);
      break;
    case 0x1b50d2:
      pSBGData->TS = *(uint *)(frame + 6);
      pSBGData->magX = (double)*(float *)(frame + 0xc);
      pSBGData->magY = (double)*(float *)(frame + 0x10);
      pSBGData->magZ = (double)*(float *)(frame + 0x14);
      break;
    case 0x1b51db:
      pSBGData->TS = *(uint *)(frame + 6);
      pSBGData->accX = (double)*(float *)(frame + 0xc);
      pSBGData->accY = (double)*(float *)(frame + 0x10);
      pSBGData->accZ = (double)*(float *)(frame + 0x14);
      pSBGData->gyrX = (double)*(float *)(frame + 0x18);
      pSBGData->gyrY = (double)*(float *)(frame + 0x1c);
      pSBGData->gyrZ = (double)*(float *)(frame + 0x20);
      pSBGData->temp = (double)*(float *)(frame + 0x24);
      break;
    case 0x1b5342:
      pSBGData->TS = *(uint *)(frame + 6);
      pSBGData->roll = ((double)*(float *)(frame + 10) * 180.0) / 3.141592653589793;
      pSBGData->pitch = ((double)*(float *)(frame + 0xe) * 180.0) / 3.141592653589793;
      pSBGData->yaw = ((double)*(float *)(frame + 0x12) * 180.0) / 3.141592653589793;
      pSBGData->eulerStdDev[0] = *(float *)(frame + 0x16);
      pSBGData->eulerStdDev[1] = *(float *)(frame + 0x1a);
      pSBGData->eulerStdDev[2] = *(float *)(frame + 0x1e);
      dVar8 = (pSBGData->roll * 3.141592653589793) / 180.0;
      dVar7 = (pSBGData->pitch * 3.141592653589793) / 180.0;
      dVar2 = (pSBGData->yaw * 3.141592653589793) / 180.0;
      dVar4 = pSBG->rollorientation;
      dVar1 = pSBG->rollp1;
      dVar3 = cos(dVar8 + pSBG->rollp2);
      dVar4 = fmod_2PI(dVar1 * dVar3 + dVar8 + dVar4);
      pSBGData->Roll = dVar4;
      dVar4 = pSBG->pitchorientation;
      dVar1 = pSBG->pitchp1;
      dVar8 = cos(dVar7 + pSBG->pitchp2);
      dVar4 = fmod_2PI(dVar1 * dVar8 + dVar7 + dVar4);
      pSBGData->Pitch = dVar4;
      dVar4 = pSBG->yaworientation;
      dVar1 = pSBG->yawp1;
      dVar8 = cos(dVar2 + pSBG->yawp2);
      dVar4 = fmod_2PI(dVar1 * dVar8 + dVar2 + dVar4);
      pSBGData->Yaw = dVar4;
      break;
    case 0x1b5665:
      pSBGData->TS = *(uint *)(frame + 6);
      pSBGData->q0 = (double)*(float *)(frame + 10);
      pSBGData->q1 = (double)*(float *)(frame + 0xe);
      pSBGData->q2 = (double)*(float *)(frame + 0x12);
      pSBGData->q3 = (double)*(float *)(frame + 0x16);
      pSBGData->eulerStdDev[0] = *(float *)(frame + 0x1a);
      pSBGData->eulerStdDev[1] = *(float *)(frame + 0x1e);
      pSBGData->eulerStdDev[2] = *(float *)(frame + 0x22);
      dVar4 = pSBGData->q2;
      dVar1 = pSBGData->q3;
      dVar8 = pSBGData->q0;
      dVar7 = pSBGData->q1;
      dVar2 = sqr(pSBGData->q0);
      dVar3 = sqr(pSBGData->q3);
      dVar4 = atan2(dVar4 * 2.0 * dVar1 + dVar8 * 2.0 * dVar7,(dVar2 + dVar2 + dVar3 * 2.0) - 1.0);
      if (-1.0 <= pSBGData->q1 * 2.0 * pSBGData->q3 + -(pSBGData->q0 * 2.0 * pSBGData->q2)) {
        if (pSBGData->q1 * 2.0 * pSBGData->q3 + -(pSBGData->q0 * 2.0 * pSBGData->q2) <= 1.0) {
          local_b8 = pSBGData->q1 * 2.0 * pSBGData->q3 + -(pSBGData->q0 * 2.0 * pSBGData->q2);
        }
        else {
          local_b8 = 1.0;
        }
        local_b0 = local_b8;
      }
      else {
        local_b0 = -1.0;
      }
      dVar3 = asin(local_b0);
      dVar3 = -dVar3;
      dVar1 = pSBGData->q1;
      dVar8 = pSBGData->q2;
      dVar7 = pSBGData->q0;
      dVar2 = pSBGData->q3;
      dVar5 = sqr(pSBGData->q0);
      dVar6 = sqr(pSBGData->q1);
      dVar7 = atan2(dVar1 * 2.0 * dVar8 + dVar7 * 2.0 * dVar2,(dVar5 + dVar5 + dVar6 * 2.0) - 1.0);
      pSBGData->roll = (dVar4 * 180.0) / 3.141592653589793;
      pSBGData->pitch = (dVar3 * 180.0) / 3.141592653589793;
      pSBGData->yaw = (dVar7 * 180.0) / 3.141592653589793;
      dVar1 = pSBG->rollorientation;
      dVar8 = pSBG->rollp1;
      dVar2 = cos(dVar4 + pSBG->rollp2);
      dVar4 = fmod_2PI(dVar8 * dVar2 + dVar4 + dVar1);
      pSBGData->Roll = dVar4;
      dVar4 = pSBG->pitchorientation;
      dVar1 = pSBG->pitchp1;
      dVar8 = cos(dVar3 + pSBG->pitchp2);
      dVar4 = fmod_2PI(dVar1 * dVar8 + dVar3 + dVar4);
      pSBGData->Pitch = dVar4;
      dVar4 = pSBG->yaworientation;
      dVar1 = pSBG->yawp1;
      dVar8 = cos(dVar7 + pSBG->yawp2);
      dVar4 = fmod_2PI(dVar1 * dVar8 + dVar7 + dVar4);
      pSBGData->Yaw = dVar4;
      break;
    case 0x1b5c45:
      pSBGData->TS = *(uint *)(frame + 6);
      pSBGData->Vel_X = (double)*(float *)(frame + 10);
      pSBGData->Vel_Y = (double)*(float *)(frame + 0xe);
      pSBGData->Vel_Z = (double)*(float *)(frame + 0x12);
      pSBGData->velocityStdDev[0] = *(float *)(frame + 0x16);
      pSBGData->velocityStdDev[1] = *(float *)(frame + 0x1a);
      pSBGData->velocityStdDev[2] = *(float *)(frame + 0x1e);
      pSBGData->Lat = *(double *)(frame + 0x22);
      pSBGData->Long = *(double *)(frame + 0x2a);
      pSBGData->Alt = *(double *)(frame + 0x32);
      pSBGData->positionStdDev[0] = *(float *)(frame + 0x3e);
      pSBGData->positionStdDev[1] = *(float *)(frame + 0x42);
      pSBGData->positionStdDev[2] = *(float *)(frame + 0x46);
      break;
    case 0x1b5e95:
      pSBGData->TS = *(uint *)(frame + 6);
      pSBGData->heave_period = (double)*(float *)(frame + 10);
      pSBGData->surge = (double)*(float *)(frame + 0xe);
      pSBGData->sway = (double)*(float *)(frame + 0x12);
      pSBGData->heave = (double)*(float *)(frame + 0x16);
      pSBGData->surge_accel = (double)*(float *)(frame + 0x1a);
      pSBGData->sway_accel = (double)*(float *)(frame + 0x1e);
      pSBGData->heave_accel = (double)*(float *)(frame + 0x22);
      pSBGData->surge_vel = (double)*(float *)(frame + 0x26);
      pSBGData->sway_vel = (double)*(float *)(frame + 0x2a);
      pSBGData->heave_vel = (double)*(float *)(frame + 0x2e);
      break;
    case 0x1b6093:
      pSBGData->TS = *(uint *)(frame + 6);
      pSBGData->odometerVelocity = (double)*(float *)(frame + 0xc);
      break;
    case 0x1b6105:
      goto switchD_001b4f58_caseD_1b6105;
    }
  }
  else {
switchD_001b4f58_caseD_1b6105:
  }
  return 0;
}

Assistant:

inline int ProcessFrameSBG(SBG* pSBG, unsigned char* frame, int framelen, int mid, int mclass, SBGDATA* pSBGData)
{
	int offset = 0;
	unsigned char ucval = 0;
	uShort_SBG usval;
	uInt_SBG uival;
	uFloat_SBG fval;
	uDouble_SBG dval;
	double roll = 0, pitch = 0, yaw = 0;

	UNREFERENCED_PARAMETER(framelen);

	//memset(pSBGData, 0, sizeof(SBGDATA));

	switch (mclass)
	{
	case SBG_ECOM_CLASS_LOG_ECOM_0:
		switch (mid)
		{
		case SBG_ECOM_LOG_UTC_TIME:
			offset = FRAME_HEADER_LEN_SBG;
			memcpy(uival.c, frame+offset, 4);
			pSBGData->TS = uival.v;
			offset += 4;
			memcpy(usval.c, frame+offset, 2);
			pSBGData->UTCTime.Valid = (unsigned char)((usval.v&0x03C0)>>6);
			offset += 2;
			memcpy(usval.c, frame+offset, 2);
			pSBGData->UTCTime.Year = usval.v;
			offset += 2;
			memcpy(&ucval, frame+offset, 1);
			pSBGData->UTCTime.Month = ucval;
			offset += 1;
			memcpy(&ucval, frame+offset, 1);
			pSBGData->UTCTime.Day = ucval;
			offset += 1;
			memcpy(&ucval, frame+offset, 1);
			pSBGData->UTCTime.Hour = ucval;
			offset += 1;
			memcpy(&ucval, frame+offset, 1);
			pSBGData->UTCTime.Minute = ucval;
			offset += 1;
			memcpy(&ucval, frame+offset, 1);
			pSBGData->UTCTime.Seconds = ucval;
			offset += 1;
			memcpy(uival.c, frame+offset, 4);
			pSBGData->UTCTime.Nanoseconds = uival.v;
			offset += 4;
			memcpy(uival.c, frame+offset, 4);
			offset += 4;
			break;
		case SBG_ECOM_LOG_MAG:
			offset = FRAME_HEADER_LEN_SBG;
			memcpy(uival.c, frame+offset, 4);
			pSBGData->TS = uival.v;
			offset += 4;
			memcpy(usval.c, frame+offset, 2);
			offset += 2;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->magX = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->magY = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->magZ = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			offset += 4;
			break;
		case SBG_ECOM_LOG_IMU_DATA:
			offset = FRAME_HEADER_LEN_SBG;
			memcpy(uival.c, frame+offset, 4);
			pSBGData->TS = uival.v;
			offset += 4;
			memcpy(usval.c, frame+offset, 2);
			offset += 2;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->accX = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->accY = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->accZ = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->gyrX = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->gyrY = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->gyrZ = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->temp = fval.v;
			offset += 4;
			break;
		case SBG_ECOM_LOG_EKF_EULER:
			offset = FRAME_HEADER_LEN_SBG;
			memcpy(uival.c, frame+offset, 4);
			pSBGData->TS = uival.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->roll = fval.v*180.0/M_PI;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->pitch = fval.v*180.0/M_PI;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->yaw = fval.v*180.0/M_PI;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->eulerStdDev[0] = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->eulerStdDev[1] = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->eulerStdDev[2] = fval.v;
			offset += 4;
			memcpy(uival.c, frame+offset, 4);
			offset += 4;
			roll = pSBGData->roll*M_PI/180.0;
			pitch = pSBGData->pitch*M_PI/180.0;
			yaw = pSBGData->yaw*M_PI/180.0;

			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pSBGData->Roll = fmod_2PI(roll+pSBG->rollorientation+pSBG->rollp1*cos(roll+pSBG->rollp2));
			pSBGData->Pitch = fmod_2PI(pitch+pSBG->pitchorientation+pSBG->pitchp1*cos(pitch+pSBG->pitchp2));
			pSBGData->Yaw = fmod_2PI(yaw+pSBG->yaworientation+pSBG->yawp1*cos(yaw+pSBG->yawp2));
			break;
		case SBG_ECOM_LOG_EKF_QUAT:
			offset = FRAME_HEADER_LEN_SBG;
			memcpy(uival.c, frame+offset, 4);
			pSBGData->TS = uival.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->q0 = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->q1 = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->q2 = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->q3 = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->eulerStdDev[0] = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->eulerStdDev[1] = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->eulerStdDev[2] = fval.v;
			offset += 4;
			memcpy(uival.c, frame+offset, 4);
			offset += 4;
			roll = atan2(2*pSBGData->q2*pSBGData->q3+2*pSBGData->q0*pSBGData->q1, 2*sqr(pSBGData->q0)+2*sqr(pSBGData->q3)-1);
			pitch = -asin(constrain(2*pSBGData->q1*pSBGData->q3-2*pSBGData->q0*pSBGData->q2, -1, 1)); // Attempt to avoid potential NAN...
			yaw = atan2(2*pSBGData->q1*pSBGData->q2+2*pSBGData->q0*pSBGData->q3, 2*sqr(pSBGData->q0)+2*sqr(pSBGData->q1)-1);
			// If raw Euler angles were not sent, ensure that they would still be in the log file.
			pSBGData->roll = roll*180.0/M_PI;
			pSBGData->pitch = pitch*180.0/M_PI;
			pSBGData->yaw = yaw*180.0/M_PI;

			// Apply corrections (magnetic, orientation of the sensor w.r.t. coordinate system...).
			pSBGData->Roll = fmod_2PI(roll+pSBG->rollorientation+pSBG->rollp1*cos(roll+pSBG->rollp2));
			pSBGData->Pitch = fmod_2PI(pitch+pSBG->pitchorientation+pSBG->pitchp1*cos(pitch+pSBG->pitchp2));
			pSBGData->Yaw = fmod_2PI(yaw+pSBG->yaworientation+pSBG->yawp1*cos(yaw+pSBG->yawp2));
			break;
		case SBG_ECOM_LOG_EKF_NAV:
			offset = FRAME_HEADER_LEN_SBG;
			memcpy(uival.c, frame+offset, 4);
			pSBGData->TS = uival.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->Vel_X = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->Vel_Y = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->Vel_Z = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->velocityStdDev[0] = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->velocityStdDev[1] = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->velocityStdDev[2] = fval.v;
			offset += 4;
			memcpy(dval.c, frame+offset, 8);
			pSBGData->Lat = dval.v;
			offset += 8;
			memcpy(dval.c, frame+offset, 8);
			pSBGData->Long = dval.v;
			offset += 8;
			memcpy(dval.c, frame+offset, 8);
			pSBGData->Alt = dval.v;
			offset += 8;
			memcpy(fval.c, frame+offset, 4);
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->positionStdDev[0] = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->positionStdDev[1] = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->positionStdDev[2] = fval.v;
			offset += 4;
			memcpy(uival.c, frame+offset, 4);
			offset += 4;
			break;
		case SBG_ECOM_LOG_SHIP_MOTION:
			offset = FRAME_HEADER_LEN_SBG;
			memcpy(uival.c, frame+offset, 4);
			pSBGData->TS = uival.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->heave_period = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->surge = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->sway = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->heave = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->surge_accel = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->sway_accel = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->heave_accel = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->surge_vel = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->sway_vel = fval.v;
			offset += 4;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->heave_vel = fval.v;
			offset += 4;
			memcpy(usval.c, frame+offset, 2);
			offset += 2;
			break;
		case SBG_ECOM_LOG_ODO_VEL:
			offset = FRAME_HEADER_LEN_SBG;
			memcpy(uival.c, frame+offset, 4);
			pSBGData->TS = uival.v;
			offset += 4;
			memcpy(usval.c, frame+offset, 2);
			offset += 2;
			memcpy(fval.c, frame+offset, 4);
			pSBGData->odometerVelocity = fval.v;
			offset += 4;
			break;
		default:
			// Unhandled...
			break;
		}
		break;
	default:
		// Unhandled...
		break;
	}

	return EXIT_SUCCESS;
}